

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

int If_DsdObjCreate(If_DsdMan_t *p,int Type,int *pLits,int nLits,int truthId)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  void *pvVar5;
  If_DsdObj_t *pIVar6;
  ulong uVar7;
  
  if (nLits != 3 && Type == 5) {
    __assert_fail("Type != DAU_DSD_MUX || nLits == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x3c3,"int If_DsdObjCreate(If_DsdMan_t *, int, int *, int, int)");
  }
  if (Type == 5) {
    iVar2 = Abc_LitIsCompl(pLits[1]);
    if (iVar2 != 0) {
      iVar2 = Abc_LitIsCompl(pLits[2]);
      if (iVar2 != 0) {
        __assert_fail("Type != DAU_DSD_MUX || !Abc_LitIsCompl(pLits[1]) || !Abc_LitIsCompl(pLits[2])"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x3c5,"int If_DsdObjCreate(If_DsdMan_t *, int, int *, int, int)");
      }
    }
  }
  else if (Type - 3U < 2) {
    uVar7 = 0;
    uVar4 = 0;
    if (0 < nLits) {
      uVar4 = (ulong)(uint)nLits;
    }
    iVar2 = -1;
    for (; uVar4 != uVar7; uVar7 = uVar7 + 1) {
      iVar1 = Abc_Lit2Var(pLits[uVar7]);
      pvVar5 = Vec_PtrEntry(&p->vObjs,iVar1);
      if (Type == 4) {
        if ((*(uint *)((long)pvVar5 + 4) & 7) == 4) {
          __assert_fail("Type != DAU_DSD_XOR || If_DsdObjType(pFanin) != DAU_DSD_XOR",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                        ,0x3cd,"int If_DsdObjCreate(If_DsdMan_t *, int, int *, int, int)");
        }
      }
      else if (Type == 3) {
        iVar1 = Abc_LitIsCompl(pLits[uVar7]);
        if ((iVar1 == 0) && ((*(uint *)((long)pvVar5 + 4) & 7) == 3)) {
          __assert_fail("Type != DAU_DSD_AND || Abc_LitIsCompl(pLits[i]) || If_DsdObjType(pFanin) != DAU_DSD_AND"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                        ,0x3cc,"int If_DsdObjCreate(If_DsdMan_t *, int, int *, int, int)");
        }
      }
      if (iVar2 != -1) {
        iVar2 = If_DsdObjCompare(p,&p->vObjs,iVar2,pLits[uVar7]);
        if (0 < iVar2) {
          __assert_fail("iPrev == -1 || If_DsdObjCompare(p, &p->vObjs, iPrev, pLits[i]) <= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                        ,0x3ce,"int If_DsdObjCreate(If_DsdMan_t *, int, int *, int, int)");
        }
      }
      iVar2 = pLits[uVar7];
    }
  }
  pIVar6 = If_DsdObjAlloc(p,Type,nLits);
  if (Type == 6) {
    if ((*(uint *)&pIVar6->field_0x4 < 0x18000000) || ((*(uint *)&pIVar6->field_0x4 & 7) != 6)) {
      __assert_fail("pObj->Type == IF_DSD_PRIME && pObj->nFans > 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                    ,0x74,"void If_DsdObjSetTruth(If_DsdMan_t *, If_DsdObj_t *, int)");
    }
    Vec_IntWriteEntry(&p->vTruths,pIVar6->Id,truthId);
  }
  if ((pIVar6->field_0x4 & 0xf8) == 0) {
    uVar7 = 0;
    uVar4 = (ulong)(uint)nLits;
    if (nLits < 1) {
      uVar4 = uVar7;
    }
    for (; uVar4 != uVar7; uVar7 = uVar7 + 1) {
      uVar3 = pLits[uVar7];
      (&pIVar6[1].Id)[uVar7] = uVar3;
      iVar2 = If_DsdVecLitSuppSize(&p->vObjs,uVar3);
      *(uint *)&pIVar6->field_0x4 =
           *(uint *)&pIVar6->field_0x4 & 0xffffff07 | *(uint *)&pIVar6->field_0x4 + iVar2 * 8 & 0xf8
      ;
    }
    if (p->LutSize != 0) {
      iVar2 = Abc_Var2Lit(pIVar6->Id,0);
      uVar3 = If_DsdManCheckXY_int(p,iVar2,p->LutSize,0,0,0);
      if (uVar3 == 0) {
        If_DsdVecObjSetMark(&p->vObjs,pIVar6->Id);
      }
    }
    return pIVar6->Id;
  }
  __assert_fail("pObj->nSupp == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                ,0x3d6,"int If_DsdObjCreate(If_DsdMan_t *, int, int *, int, int)");
}

Assistant:

int If_DsdObjCreate( If_DsdMan_t * p, int Type, int * pLits, int nLits, int truthId )
{
    If_DsdObj_t * pObj, * pFanin;
    int i, iPrev = -1;
    // check structural canonicity
    assert( Type != DAU_DSD_MUX || nLits == 3 );
//    assert( Type != DAU_DSD_MUX || !Abc_LitIsCompl(pLits[0]) );
    assert( Type != DAU_DSD_MUX || !Abc_LitIsCompl(pLits[1]) || !Abc_LitIsCompl(pLits[2]) );
    // check that leaves are in good order
    if ( Type == DAU_DSD_AND || Type == DAU_DSD_XOR )
    {
        for ( i = 0; i < nLits; i++ )
        {
            pFanin = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(pLits[i]) );
            assert( Type != DAU_DSD_AND || Abc_LitIsCompl(pLits[i]) || If_DsdObjType(pFanin) != DAU_DSD_AND );
            assert( Type != DAU_DSD_XOR || If_DsdObjType(pFanin) != DAU_DSD_XOR );
            assert( iPrev == -1 || If_DsdObjCompare(p, &p->vObjs, iPrev, pLits[i]) <= 0 );
            iPrev = pLits[i];
        }
    }
    // create new node
    pObj = If_DsdObjAlloc( p, Type, nLits );
    if ( Type == DAU_DSD_PRIME )
        If_DsdObjSetTruth( p, pObj, truthId );
    assert( pObj->nSupp == 0 );
    for ( i = 0; i < nLits; i++ )
    {
        pObj->pFans[i] = pLits[i];
        pObj->nSupp += If_DsdVecLitSuppSize(&p->vObjs, pLits[i]);
    }
    // check decomposability
    if ( p->LutSize && !If_DsdManCheckXY(p, Abc_Var2Lit(pObj->Id, 0), p->LutSize, 0, 0, 0, 0) )
        If_DsdVecObjSetMark( &p->vObjs, pObj->Id );
    return pObj->Id;
}